

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvbuf.c
# Opt level: O3

int quicly_recvbuf_write(quicly_recvbuf_t *buf,uint64_t offset,void *p,size_t len)

{
  int iVar1;
  
  if (len == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = quicly_ranges_add(&buf->received,offset,len + offset);
    if (iVar1 == 0) {
      iVar1 = quicly_buffer_write(&buf->data,offset - buf->data_off,p,len);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int quicly_recvbuf_write(quicly_recvbuf_t *buf, uint64_t offset, const void *p, size_t len)
{
    int ret;

    if (len == 0)
        return 0;
    if ((ret = quicly_ranges_add(&buf->received, offset, offset + len)) != 0)
        return ret;
    if ((ret = quicly_buffer_write(&buf->data, offset - buf->data_off, p, len)) != 0)
        return ret;
    return 0;
}